

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

parser_error parse_buy(parser *p)

{
  wchar_t wVar1;
  void *pvVar2;
  undefined8 *puVar3;
  char *name;
  object_buy *buy;
  store *s;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    puVar3 = (undefined8 *)mem_zalloc(0x18);
    name = parser_getstr(p,"base");
    wVar1 = tval_find_idx(name);
    puVar3[1] = (long)wVar1;
    *puVar3 = *(undefined8 *)((long)pvVar2 + 0x78);
    *(undefined8 **)((long)pvVar2 + 0x78) = puVar3;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_buy(struct parser *p) {
	struct store *s = parser_priv(p);
	struct object_buy *buy;

	if (!s)
		return PARSE_ERROR_MISSING_RECORD_HEADER;

	buy = mem_zalloc(sizeof(*buy));
	buy->tval = tval_find_idx(parser_getstr(p, "base"));
	buy->next = s->buy;
	s->buy = buy;
	return PARSE_ERROR_NONE;
}